

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlinuxfbintegration.cpp
# Opt level: O0

void __thiscall QLinuxFbIntegration::initialize(QLinuxFbIntegration *this)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  QScopedPointer<QFbVtHandler,_QScopedPointerDeleter<QFbVtHandler>_> *this_00;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QLinuxFbIntegration *in_stack_00000038;
  char *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  QFbVtHandler *in_stack_ffffffffffffffb8;
  QMessageLogger *in_stack_ffffffffffffffc0;
  QPlatformScreen *pQVar5;
  QObject *parent;
  QFbVtHandler *in_stack_ffffffffffffffd8;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parent = in_RDI;
  uVar3 = (**(code **)(**(long **)(in_RDI + 0x20) + 0x60))();
  if ((uVar3 & 1) == 0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,iVar2,
               in_stack_ffffffffffffffa8);
    QMessageLogger::warning(&stack0xffffffffffffffd8,"linuxfb: Failed to initialize screen");
  }
  else {
    in_stack_ffffffffffffffb8 = *(QFbVtHandler **)(in_RDI + 0x20);
    pQVar5 = (QPlatformScreen *)0x0;
    if (in_stack_ffffffffffffffb8 != (QFbVtHandler *)0x0) {
      pQVar5 = (QPlatformScreen *)&in_stack_ffffffffffffffb8->m_tty;
    }
    QWindowSystemInterface::handleScreenAdded(pQVar5,false);
  }
  uVar4 = QPlatformInputContextFactory::create();
  *(undefined8 *)(in_RDI + 0x28) = uVar4;
  this_00 = (QScopedPointer<QFbVtHandler,_QScopedPointerDeleter<QFbVtHandler>_> *)operator_new(0x28)
  ;
  QFbVtHandler::QFbVtHandler(in_stack_ffffffffffffffd8,parent);
  QScopedPointer<QFbVtHandler,_QScopedPointerDeleter<QFbVtHandler>_>::reset
            (this_00,in_stack_ffffffffffffffb8);
  iVar2 = qEnvironmentVariableIntValue("QT_QPA_FB_DISABLE_INPUT",(bool *)0x0);
  if (iVar2 == 0) {
    createInputHandlers(in_stack_00000038);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLinuxFbIntegration::initialize()
{
    if (m_primaryScreen->initialize())
        QWindowSystemInterface::handleScreenAdded(m_primaryScreen);
    else
        qWarning("linuxfb: Failed to initialize screen");

    m_inputContext = QPlatformInputContextFactory::create();

    m_vtHandler.reset(new QFbVtHandler);

    if (!qEnvironmentVariableIntValue("QT_QPA_FB_DISABLE_INPUT"))
        createInputHandlers();
}